

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O0

void cff_make_private_dict(CFF_SubFont subfont,PS_Private priv)

{
  byte bVar1;
  uint local_24;
  FT_UInt count;
  FT_UInt n;
  CFF_Private cpriv;
  PS_Private priv_local;
  CFF_SubFont subfont_local;
  
  memset(priv,0,0xe0);
  bVar1 = (subfont->private_dict).num_blue_values;
  priv->num_blue_values = bVar1;
  for (local_24 = 0; local_24 < bVar1; local_24 = local_24 + 1) {
    priv->blue_values[local_24] = (FT_Short)(subfont->private_dict).blue_values[local_24];
  }
  bVar1 = (subfont->private_dict).num_other_blues;
  priv->num_other_blues = bVar1;
  for (local_24 = 0; local_24 < bVar1; local_24 = local_24 + 1) {
    priv->other_blues[local_24] = (FT_Short)(subfont->private_dict).other_blues[local_24];
  }
  bVar1 = (subfont->private_dict).num_family_blues;
  priv->num_family_blues = bVar1;
  for (local_24 = 0; local_24 < bVar1; local_24 = local_24 + 1) {
    priv->family_blues[local_24] = (FT_Short)(subfont->private_dict).family_blues[local_24];
  }
  bVar1 = (subfont->private_dict).num_family_other_blues;
  priv->num_family_other_blues = bVar1;
  for (local_24 = 0; local_24 < bVar1; local_24 = local_24 + 1) {
    priv->family_other_blues[local_24] =
         (FT_Short)(subfont->private_dict).family_other_blues[local_24];
  }
  priv->blue_scale = (subfont->private_dict).blue_scale;
  priv->blue_shift = (FT_Int)(subfont->private_dict).blue_shift;
  priv->blue_fuzz = (FT_Int)(subfont->private_dict).blue_fuzz;
  priv->standard_width[0] = (FT_UShort)(subfont->private_dict).standard_width;
  priv->standard_height[0] = (FT_UShort)(subfont->private_dict).standard_height;
  bVar1 = (subfont->private_dict).num_snap_widths;
  priv->num_snap_widths = bVar1;
  for (local_24 = 0; local_24 < bVar1; local_24 = local_24 + 1) {
    priv->snap_widths[local_24] = (FT_Short)(subfont->private_dict).snap_widths[local_24];
  }
  bVar1 = (subfont->private_dict).num_snap_heights;
  priv->num_snap_heights = bVar1;
  for (local_24 = 0; local_24 < bVar1; local_24 = local_24 + 1) {
    priv->snap_heights[local_24] = (FT_Short)(subfont->private_dict).snap_heights[local_24];
  }
  priv->force_bold = (subfont->private_dict).force_bold;
  priv->language_group = (long)(subfont->private_dict).language_group;
  priv->lenIV = (subfont->private_dict).lenIV;
  return;
}

Assistant:

static void
  cff_make_private_dict( CFF_SubFont  subfont,
                         PS_Private   priv )
  {
    CFF_Private  cpriv = &subfont->private_dict;
    FT_UInt      n, count;


    FT_ZERO( priv );

    count = priv->num_blue_values = cpriv->num_blue_values;
    for ( n = 0; n < count; n++ )
      priv->blue_values[n] = (FT_Short)cpriv->blue_values[n];

    count = priv->num_other_blues = cpriv->num_other_blues;
    for ( n = 0; n < count; n++ )
      priv->other_blues[n] = (FT_Short)cpriv->other_blues[n];

    count = priv->num_family_blues = cpriv->num_family_blues;
    for ( n = 0; n < count; n++ )
      priv->family_blues[n] = (FT_Short)cpriv->family_blues[n];

    count = priv->num_family_other_blues = cpriv->num_family_other_blues;
    for ( n = 0; n < count; n++ )
      priv->family_other_blues[n] = (FT_Short)cpriv->family_other_blues[n];

    priv->blue_scale = cpriv->blue_scale;
    priv->blue_shift = (FT_Int)cpriv->blue_shift;
    priv->blue_fuzz  = (FT_Int)cpriv->blue_fuzz;

    priv->standard_width[0]  = (FT_UShort)cpriv->standard_width;
    priv->standard_height[0] = (FT_UShort)cpriv->standard_height;

    count = priv->num_snap_widths = cpriv->num_snap_widths;
    for ( n = 0; n < count; n++ )
      priv->snap_widths[n] = (FT_Short)cpriv->snap_widths[n];

    count = priv->num_snap_heights = cpriv->num_snap_heights;
    for ( n = 0; n < count; n++ )
      priv->snap_heights[n] = (FT_Short)cpriv->snap_heights[n];

    priv->force_bold     = cpriv->force_bold;
    priv->language_group = cpriv->language_group;
    priv->lenIV          = cpriv->lenIV;
  }